

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_lzop.c
# Opt level: O0

void test_option_lzop(void)

{
  wchar_t wVar1;
  ulong local_20;
  size_t s;
  char *pcStack_10;
  int r;
  char *p;
  
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_lzop.c"
                      ,L'\x11',"f",L'Ƥ',L'\xffffffff',"a");
  s._4_4_ = systemf("echo f | %s -o --lzop >archive.out 2>archive.err",testprog);
  pcStack_10 = slurpfile(&local_20,"archive.err");
  free(pcStack_10);
  if (s._4_4_ == L'\0') {
    pcStack_10 = slurpfile(&local_20,"archive.out");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_lzop.c"
                     ,L'#',(uint)(2 < local_20),"s > 2",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_lzop.c"
                        ,L'$',pcStack_10,"p",anon_var_dwarf_9af6,
                        "\"\\x89\\x4c\\x5a\\x4f\\x00\\x0d\\x0a\\x1a\\x0a\"",9,"9",(void *)0x0);
    free(pcStack_10);
  }
  else {
    wVar1 = canLzop();
    if (wVar1 == L'\0') {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_lzop.c"
                     ,L'\x1a');
      test_skipping("lzop is not supported on this platform");
    }
    else {
      failure("--lzop option is broken");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_lzop.c"
                          ,L'\x1e',(long)s._4_4_,"r",0,"0",(void *)0x0);
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_option_lzop)
{
	char *p;
	int r;
	size_t s;

	/* Create a file. */
	assertMakeFile("f", 0644, "a");

	/* Archive it with lzop compression. */
	r = systemf("echo f | %s -o --lzop >archive.out 2>archive.err",
	    testprog);
	p = slurpfile(&s, "archive.err");
	free(p);
	if (r != 0) {
		if (!canLzop()) {
			skipping("lzop is not supported on this platform");
			return;
		}
		failure("--lzop option is broken");
		assertEqualInt(r, 0);
		return;
	}
	/* Check that the archive file has an lzma signature. */
	p = slurpfile(&s, "archive.out");
	assert(s > 2);
	assertEqualMem(p, "\x89\x4c\x5a\x4f\x00\x0d\x0a\x1a\x0a", 9);
	free(p);
}